

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

HRESULT __thiscall
Js::GlobalObject::SetDirectHostObject
          (GlobalObject *this,RecyclableObject *hostObject,RecyclableObject *secureDirectHostObject)

{
  bool bVar1;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar2;
  ScriptContext *this_01;
  ScriptConfiguration *this_02;
  Var pvVar3;
  OutOfMemoryException anon_var_0;
  AutoNestedHandledExceptionType local_28;
  HRESULT local_24;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  RecyclableObject *secureDirectHostObject_local;
  RecyclableObject *hostObject_local;
  GlobalObject *this_local;
  
  local_24 = 0;
  ___autoNestedHandledExceptionType = secureDirectHostObject;
  Memory::WriteBarrierPtr<Js::RecyclableObject>::operator=(&this->directHostObject,hostObject);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::operator=
            (&this->secureDirectHostObject,___autoNestedHandledExceptionType);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_28,ExceptionType_OutOfMemory);
  this_00 = Memory::WriteBarrierPtr<Js::JavascriptLibrary>::operator->(&this->library);
  pRVar2 = JavascriptLibraryBase::GetNull(&this_00->super_JavascriptLibraryBase);
  (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x4b])(this,pRVar2);
  this_01 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_02 = ScriptContext::GetConfig(this_01);
  bVar1 = ScriptConfiguration::IsESGlobalThisEnabled(this_02);
  if (bVar1) {
    pvVar3 = ToThis(this);
    (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
              (this,0x1a1,pvVar3,0,0);
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_28);
  return local_24;
}

Assistant:

HRESULT GlobalObject::SetDirectHostObject(RecyclableObject* hostObject, RecyclableObject* secureDirectHostObject)
    {
        HRESULT hr = S_OK;

        this->directHostObject = hostObject;
        this->secureDirectHostObject = secureDirectHostObject;

        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        {
            // In fastDOM scenario, we should use the host object to lookup the prototype.
            this->SetPrototype(library->GetNull());

            // Host can call to set the direct host object after the GlobalObject has been initialized but
            // before user script has run. (This happens even before the previous call to SetPrototype)
            // If that happens, we'll need to update the 'globalThis' property to point to the secure
            // host object so that we don't hand a reference to the bare GlobalObject out to user script.
            if (this->GetScriptContext()->GetConfig()->IsESGlobalThisEnabled())
            {
                this->SetProperty(PropertyIds::globalThis, this->ToThis(), PropertyOperation_None, nullptr);
            }
        }